

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

void llvm::DWARFDebugLoclists::dumpRange
               (DWARFDataExtractor *Data,uint64_t StartOffset,uint64_t Size,uint16_t Version,
               raw_ostream *OS,uint64_t BaseAddr,MCRegisterInfo *MRI,DIDumpOptions DumpOpts)

{
  bool bVar1;
  raw_ostream *__n;
  void *__buf;
  size_t sVar2;
  char *pcVar3;
  StringRef Str;
  StringRef Str_00;
  ulong local_38;
  uint64_t Offset;
  
  if ((StartOffset <= Size + StartOffset) &&
     ((Size + StartOffset) - 1 < (Data->super_DataExtractor).Data.Length)) {
    sVar2 = 0;
    pcVar3 = (char *)0x0;
    local_38 = StartOffset;
    do {
      if (Size + StartOffset <= local_38) {
        return;
      }
      Str.Length = sVar2;
      Str.Data = pcVar3;
      raw_ostream::operator<<(OS,Str);
      __n = OS;
      bVar1 = dumpLocationList(Data,&local_38,Version,OS,BaseAddr,MRI,(DWARFUnit *)0x0,DumpOpts,0xc)
      ;
      pcVar3 = OS->OutBufCur;
      if (pcVar3 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar3 + 1;
        *pcVar3 = '\n';
      }
      else {
        raw_ostream::write(OS,10,__buf,(size_t)__n);
      }
      sVar2 = 1;
      pcVar3 = "\n";
    } while (bVar1);
    return;
  }
  Str_00.Length = 0x13;
  Str_00.Data = "Invalid dump range\n";
  raw_ostream::operator<<(OS,Str_00);
  return;
}

Assistant:

void DWARFDebugLoclists::dumpRange(const DWARFDataExtractor &Data,
                                   uint64_t StartOffset, uint64_t Size,
                                   uint16_t Version, raw_ostream &OS,
                                   uint64_t BaseAddr, const MCRegisterInfo *MRI,
                                   DIDumpOptions DumpOpts) {
  if (!Data.isValidOffsetForDataOfSize(StartOffset, Size))  {
    OS << "Invalid dump range\n";
    return;
  }
  uint64_t Offset = StartOffset;
  StringRef Separator;
  bool CanContinue = true;
  while (CanContinue && Offset < StartOffset + Size) {
    OS << Separator;
    Separator = "\n";

    CanContinue = dumpLocationList(Data, &Offset, Version, OS, BaseAddr, MRI,
                                   nullptr, DumpOpts, /*Indent=*/12);
    OS << '\n';
  }
}